

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fiber.c
# Opt level: O0

void coro__yield_test(sx_fiber_transfer __transfer)

{
  undefined8 *puVar1;
  int local_24;
  int i;
  coro_data *d;
  sx_fiber_transfer __transfer_local;
  
  puVar1 = (undefined8 *)__transfer.user;
  d = (coro_data *)__transfer.from;
  __transfer_local.from = puVar1;
  puts("fiber_pass_fn: Start");
  puts("fiber_pass_fn: Pass and continue on next frame ..");
  sx__coro_yield((sx_coro_context *)*puVar1,&d,1);
  puts("fiber_pass_fn: Continue");
  puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
  sx__coro_yield((sx_coro_context *)*puVar1,&d,100);
  puts("fiber_pass_fn: Continue next 10 frames");
  local_24 = 0;
  while( true ) {
    if (9 < local_24) break;
    printf("fiber_pass_fn: Continue frame: %i\n",(ulong)*(uint *)(puVar1 + 1));
    sx__coro_yield((sx_coro_context *)*puVar1,&d,1);
    local_24 = local_24 + 1;
  }
  puts("fiber_pass_fn: End");
  sx__coro_end((sx_coro_context *)*puVar1,&d);
  return;
}

Assistant:

sx_coro_declare(yield_test)
{
    coro_data* d = sx_coro_userdata();
    puts("fiber_pass_fn: Start");

    puts("fiber_pass_fn: Pass and continue on next frame ..");
    sx_coro_yield(d->ctx);
    puts("fiber_pass_fn: Continue");

    puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
    sx_coro_yieldn(d->ctx, 100);

    puts("fiber_pass_fn: Continue next 10 frames");
    int i = 0;
    while (i++ < 10) {
        printf("fiber_pass_fn: Continue frame: %i\n", d->frame);
        sx_coro_yield(d->ctx);
    }

    puts("fiber_pass_fn: End");
    sx_coro_end(d->ctx);    // Always call this !
}